

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::qualitystatistics(tetgenmesh *this)

{
  int iVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_710;
  double local_708;
  double local_700;
  double local_6f8;
  double local_6d8;
  double local_6d0;
  int local_6bc;
  int attrnum;
  int j;
  int i;
  int tendegree;
  int aspectindex;
  int radiusindex;
  int indx [4];
  unsigned_long faceangletable [18];
  unsigned_long dihedangletable [18];
  unsigned_long aspecttable [16];
  unsigned_long radiustable [12];
  double bigfaangle;
  double smallfaangle;
  double bigdiangle;
  double smalldiangle;
  double tetradius;
  double tetaspect;
  double longlen;
  double shortlen;
  double minheightinv;
  double cirradius;
  double minaltitude;
  double tetvol;
  double total_tetprism_vol;
  double total_tet_vol;
  double biggestfaangle;
  double smallestfaangle;
  double biggestdiangle;
  double smallestdiangle;
  double biggestratio;
  double smallestratio;
  double biggestvolume;
  double smallestvolume;
  double longest;
  double shortest;
  double faceangle [3];
  double dStack_3b8;
  double alldihed [6];
  double edgelength [6];
  double H [4];
  double N [4] [3];
  double V [6] [3];
  double local_240;
  double D;
  double rhs [4];
  double A [4] [4];
  double aspectratiotable [12];
  double radiusratiotable [12];
  char sbuf [128];
  point p [4];
  undefined1 local_30 [8];
  triface neightet;
  triface tetloop;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)local_30);
  printf("Mesh quality statistics:\n\n");
  tetaspect = 0.0;
  longlen = 0.0;
  smallfaangle = 0.0;
  bigdiangle = 0.0;
  aspectratiotable[0xb] = 0.707;
  radiusratiotable[0] = 1.0;
  radiusratiotable[1] = 1.1;
  radiusratiotable[2] = 1.2;
  radiusratiotable[3] = 1.4;
  radiusratiotable[4] = 1.6;
  radiusratiotable[5] = 1.8;
  radiusratiotable[6] = 2.0;
  radiusratiotable[7] = 2.5;
  radiusratiotable[8] = 3.0;
  radiusratiotable[9] = 10.0;
  radiusratiotable[10] = 0.0;
  A[3][3] = 1.5;
  aspectratiotable[0] = 2.0;
  aspectratiotable[1] = 2.5;
  aspectratiotable[2] = 3.0;
  aspectratiotable[3] = 4.0;
  aspectratiotable[4] = 6.0;
  aspectratiotable[5] = 10.0;
  aspectratiotable[6] = 15.0;
  aspectratiotable[7] = 25.0;
  aspectratiotable[8] = 50.0;
  aspectratiotable[9] = 100.0;
  aspectratiotable[10] = 0.0;
  for (attrnum = 0; attrnum < 0xc; attrnum = attrnum + 1) {
    aspecttable[(long)attrnum + 0xf] = 0;
  }
  for (attrnum = 0; attrnum < 0xc; attrnum = attrnum + 1) {
    dihedangletable[(long)attrnum + 0x11] = 0;
  }
  for (attrnum = 0; attrnum < 0x12; attrnum = attrnum + 1) {
    faceangletable[(long)attrnum + 0x11] = 0;
  }
  for (attrnum = 0; attrnum < 0x12; attrnum = attrnum + 1) {
    faceangletable[(long)attrnum + -1] = 0;
  }
  dVar8 = ((((this->xmax - this->xmin) + this->ymax) - this->ymin) + this->zmax) - this->zmin;
  dVar8 = dVar8 * dVar8;
  smallestvolume = 0.0;
  smallestratio = 0.0;
  biggestratio = 1e+16;
  smallestdiangle = 0.0;
  biggestfaangle = 180.0;
  biggestdiangle = 180.0;
  total_tet_vol = 0.0;
  smallestfaangle = 0.0;
  iVar1 = this->numelemattrib;
  memorypool::traversalinit(this->tetrahedrons);
  neightet._8_8_ = tetrahedrontraverse(this);
  biggestvolume = dVar8;
  longest = dVar8;
LAB_001696f4:
  do {
    if (neightet._8_8_ == 0) {
      dVar9 = sqrt(longest);
      dVar10 = sqrt(smallestvolume);
      sqrt(dVar8);
      printf("  Smallest volume: %16.5g   |  Largest volume: %16.5g\n",biggestvolume,smallestratio);
      printf("  Shortest edge:   %16.5g   |  Longest edge:   %16.5g\n",dVar9,dVar10);
      printf("  Smallest asp.ratio: %13.5g   |  Largest asp.ratio: %13.5g\n",biggestratio,
             smallestdiangle);
      sprintf((char *)(radiusratiotable + 0xb),"%.17g",total_tet_vol);
      strlen((char *)(radiusratiotable + 0xb));
      printf("  Smallest facangle: %14.5g   |  Largest facangle:       %s\n",biggestfaangle,
             radiusratiotable + 0xb);
      sprintf((char *)(radiusratiotable + 0xb),"%.17g",smallestfaangle);
      strlen((char *)(radiusratiotable + 0xb));
      printf("  Smallest dihedral: %14.5g   |  Largest dihedral:       %s\n\n",biggestdiangle,
             radiusratiotable + 0xb);
      printf("  Aspect ratio histogram:\n");
      printf("         < %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",A[3][3],
             aspectratiotable[4],aspectratiotable[5],dihedangletable[0x11],aspecttable[5]);
      for (attrnum = 1; attrnum < 5; attrnum = attrnum + 1) {
        printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
               aspectratiotable[(long)(attrnum + -1) + -1],aspectratiotable[(long)attrnum + -1],
               aspectratiotable[(long)(attrnum + 5) + -1],aspectratiotable[(long)(attrnum + 6) + -1]
               ,dihedangletable[(long)attrnum + 0x11],dihedangletable[(long)(attrnum + 6) + 0x11]);
      }
      printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g -            :  %8ld\n",aspectratiotable[3],
             aspectratiotable[4],aspectratiotable[9],aspecttable[4],aspecttable[10]);
      printf("  (A tetrahedron\'s aspect ratio is its longest edge length");
      printf(" divided by its\n");
      printf("    smallest side height)\n\n");
      printf("  Face angle histogram:\n");
      for (attrnum = 0; attrnum < 9; attrnum = attrnum + 1) {
        printf("    %3d - %3d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
               (ulong)(uint)(attrnum * 10),(ulong)(attrnum * 10 + 10),
               faceangletable[(long)attrnum + -1],(ulong)(attrnum * 10 + 0x5a),
               (ulong)(attrnum * 10 + 100),faceangletable[(long)(attrnum + 9) + -1]);
      }
      if ((this->minfaceang != PI) || (NAN(this->minfaceang) || NAN(PI))) {
        printf("  Minimum input face angle is %g (degree).\n",(this->minfaceang / PI) * 180.0);
      }
      printf("\n");
      printf("  Dihedral angle histogram:\n");
      printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0,5,
             faceangletable[0x11],0x50,0x6e,dihedangletable[8]);
      printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",5,10,
             dihedangletable[0],0x6e,0x78,dihedangletable[9]);
      for (attrnum = 2; attrnum < 7; attrnum = attrnum + 1) {
        printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
               (ulong)(uint)((attrnum + -1) * 10),(ulong)((attrnum + -1) * 10 + 10),
               faceangletable[(long)attrnum + 0x11],(ulong)((attrnum + -1) * 10 + 0x6e),
               (ulong)((attrnum + -1) * 10 + 0x78),faceangletable[(long)(attrnum + 9) + 0x11]);
      }
      printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0x3c,0x46,
             dihedangletable[6],0xaa,0xaf,dihedangletable[0xf]);
      printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0x46,0x50,
             dihedangletable[7],0xaf,0xb4,dihedangletable[0x10]);
      if ((this->minfacetdihed != PI) || (NAN(this->minfacetdihed) || NAN(PI))) {
        printf("  Minimum input dihedral angle is %g (degree).\n",(this->minfacetdihed / PI) * 180.0
              );
      }
      printf("\n");
      printf("\n");
      return;
    }
    if (this->b->convex != 0) {
      dVar9 = elemattribute(this,(tetrahedron *)neightet._8_8_,iVar1 + -1);
      if ((dVar9 == -1.0) && (!NAN(dVar9))) {
        neightet._8_8_ = tetrahedrontraverse(this);
        goto LAB_001696f4;
      }
    }
    for (attrnum = 0; attrnum < 4; attrnum = attrnum + 1) {
      p[(long)attrnum + -1] = *(point *)(neightet._8_8_ + (long)(attrnum + 4) * 8);
    }
    dVar9 = orient3dfast(this,p[0],(double *)sbuf._120_8_,p[1],p[2]);
    dVar9 = dVar9 / 6.0;
    tetprismvol(this,(double *)sbuf._120_8_,p[0],p[1],p[2]);
    if (dVar9 < biggestvolume) {
      biggestvolume = dVar9;
    }
    if (smallestratio < dVar9) {
      smallestratio = dVar9;
    }
    for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
      V[-1][(long)attrnum + 2] = *(double *)(sbuf._120_8_ + (long)attrnum * 8) - p[2][attrnum];
    }
    for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
      V[0][(long)attrnum + 2] = p[0][attrnum] - p[2][attrnum];
    }
    for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
      V[1][(long)attrnum + 2] = p[1][attrnum] - p[2][attrnum];
    }
    for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
      V[2][(long)attrnum + 2] = p[0][attrnum] - *(double *)(sbuf._120_8_ + (long)attrnum * 8);
    }
    for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
      V[3][(long)attrnum + 2] = p[1][attrnum] - p[0][attrnum];
    }
    for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
      V[4][(long)attrnum + 2] = *(double *)(sbuf._120_8_ + (long)attrnum * 8) - p[1][attrnum];
    }
    for (attrnum = 0; attrnum < 6; attrnum = attrnum + 1) {
      dVar10 = dot(this,N[(long)attrnum + 3] + 2,N[(long)attrnum + 3] + 2);
      alldihed[(long)attrnum + 5] = dVar10;
    }
    for (attrnum = 0; attrnum < 6; attrnum = attrnum + 1) {
      if (attrnum == 0) {
        tetaspect = alldihed[5];
        longlen = tetaspect;
      }
      else {
        if (longlen <= alldihed[(long)attrnum + 5]) {
          local_6d0 = longlen;
        }
        else {
          local_6d0 = alldihed[(long)attrnum + 5];
        }
        longlen = local_6d0;
        if (alldihed[(long)attrnum + 5] <= tetaspect) {
          local_6d8 = tetaspect;
        }
        else {
          local_6d8 = alldihed[(long)attrnum + 5];
        }
        tetaspect = local_6d8;
      }
      if (smallestvolume < alldihed[(long)attrnum + 5]) {
        smallestvolume = alldihed[(long)attrnum + 5];
      }
      if (alldihed[(long)attrnum + 5] < longest) {
        longest = alldihed[(long)attrnum + 5];
      }
    }
    for (local_6bc = 0; local_6bc < 3; local_6bc = local_6bc + 1) {
      for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
        A[(long)local_6bc + -1][(long)attrnum + 3] = N[(long)local_6bc + 3][(long)attrnum + 2];
      }
    }
    bVar3 = lu_decmp(this,(double (*) [4])(rhs + 3),3,&aspectindex,&local_240,0);
    if (bVar3) {
      for (local_6bc = 0; local_6bc < 3; local_6bc = local_6bc + 1) {
        for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
          rhs[(long)attrnum + -1] = 0.0;
        }
        rhs[(long)local_6bc + -1] = 1.0;
        lu_solve(this,(double (*) [4])(rhs + 3),3,&aspectindex,&D,0);
        for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
          N[(long)local_6bc + -1][(long)attrnum + 2] = rhs[(long)attrnum + -1];
        }
      }
      for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
        V[-2][(long)attrnum + 2] =
             (-H[(long)attrnum + 3] - N[0][(long)attrnum + 2]) - N[1][(long)attrnum + 2];
      }
      for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
        dVar9 = dot(this,N[(long)attrnum + 3] + 2,N[(long)attrnum + 3] + 2);
        rhs[(long)attrnum + -1] = dVar9 * 0.5;
      }
      lu_solve(this,(double (*) [4])(rhs + 3),3,&aspectindex,&D,0);
      dVar9 = dot(this,&D,&D);
      minheightinv = sqrt(dVar9);
      for (attrnum = 0; attrnum < 4; attrnum = attrnum + 1) {
        dVar9 = dot(this,N[(long)attrnum + -1] + 2,N[(long)attrnum + -1] + 2);
        dVar9 = sqrt(dVar9);
        edgelength[(long)attrnum + 5] = dVar9;
        for (local_6bc = 0; local_6bc < 3; local_6bc = local_6bc + 1) {
          N[(long)attrnum + -1][(long)local_6bc + 2] =
               N[(long)attrnum + -1][(long)local_6bc + 2] / edgelength[(long)attrnum + 5];
        }
      }
      shortlen = edgelength[5];
      for (attrnum = 1; attrnum < 4; attrnum = attrnum + 1) {
        if (shortlen < edgelength[(long)attrnum + 5]) {
          shortlen = edgelength[(long)attrnum + 5];
        }
      }
LAB_0016a36a:
      local_6bc = 0;
      for (attrnum = 1; attrnum < 4; attrnum = attrnum + 1) {
        dVar9 = dot(this,H + 3,N[(long)attrnum + -1] + 2);
        alldihed[(long)local_6bc + -1] = -dVar9;
        if (-1.0 < alldihed[(long)local_6bc + -1] || alldihed[(long)local_6bc + -1] == -1.0) {
          if (1.0 < alldihed[(long)local_6bc + -1]) {
            alldihed[(long)local_6bc + -1] = 1.0;
          }
        }
        else {
          alldihed[(long)local_6bc + -1] = -1.0;
        }
        dVar9 = acos(alldihed[(long)local_6bc + -1]);
        alldihed[(long)local_6bc + -1] = (dVar9 / PI) * 180.0;
        local_6bc = local_6bc + 1;
      }
      for (attrnum = 2; attrnum < 4; attrnum = attrnum + 1) {
        dVar9 = dot(this,N[0] + 2,N[(long)attrnum + -1] + 2);
        alldihed[(long)local_6bc + -1] = -dVar9;
        if (-1.0 < alldihed[(long)local_6bc + -1] || alldihed[(long)local_6bc + -1] == -1.0) {
          if (1.0 < alldihed[(long)local_6bc + -1]) {
            alldihed[(long)local_6bc + -1] = 1.0;
          }
        }
        else {
          alldihed[(long)local_6bc + -1] = -1.0;
        }
        dVar9 = acos(alldihed[(long)local_6bc + -1]);
        alldihed[(long)local_6bc + -1] = (dVar9 / PI) * 180.0;
        local_6bc = local_6bc + 1;
      }
      dVar9 = dot(this,N[1] + 2,N[2] + 2);
      alldihed[(long)local_6bc + -1] = -dVar9;
      if (-1.0 < alldihed[(long)local_6bc + -1] || alldihed[(long)local_6bc + -1] == -1.0) {
        if (1.0 < alldihed[(long)local_6bc + -1]) {
          alldihed[(long)local_6bc + -1] = 1.0;
        }
      }
      else {
        alldihed[(long)local_6bc + -1] = -1.0;
      }
      dVar9 = acos(alldihed[(long)local_6bc + -1]);
      alldihed[(long)local_6bc + -1] = (dVar9 / PI) * 180.0;
      for (attrnum = 0; attrnum < 6; attrnum = attrnum + 1) {
        if (attrnum == 0) {
          smallfaangle = dStack_3b8;
          bigdiangle = smallfaangle;
        }
        else {
          if (bigdiangle <= alldihed[(long)attrnum + -1]) {
            local_6f8 = bigdiangle;
          }
          else {
            local_6f8 = alldihed[(long)attrnum + -1];
          }
          bigdiangle = local_6f8;
          if (alldihed[(long)attrnum + -1] <= smallfaangle) {
            local_700 = smallfaangle;
          }
          else {
            local_700 = alldihed[(long)attrnum + -1];
          }
          smallfaangle = local_700;
        }
        if (alldihed[(long)attrnum + -1] < biggestdiangle) {
          biggestdiangle = alldihed[(long)attrnum + -1];
        }
        if (smallestfaangle < alldihed[(long)attrnum + -1]) {
          smallestfaangle = alldihed[(long)attrnum + -1];
        }
        if (5.0 < alldihed[(long)attrnum + -1] || alldihed[(long)attrnum + -1] == 5.0) {
          if ((alldihed[(long)attrnum + -1] < 5.0) ||
             (10.0 < alldihed[(long)attrnum + -1] || alldihed[(long)attrnum + -1] == 10.0)) {
            if ((alldihed[(long)attrnum + -1] < 80.0) ||
               (110.0 < alldihed[(long)attrnum + -1] || alldihed[(long)attrnum + -1] == 110.0)) {
              if ((alldihed[(long)attrnum + -1] < 170.0) ||
                 (175.0 < alldihed[(long)attrnum + -1] || alldihed[(long)attrnum + -1] == 175.0)) {
                if (alldihed[(long)attrnum + -1] < 175.0) {
                  if (80.0 < alldihed[(long)attrnum + -1] || alldihed[(long)attrnum + -1] == 80.0) {
                    j = (int)(alldihed[(long)attrnum + -1] / 10.0) + -1;
                  }
                  else {
                    j = (int)(alldihed[(long)attrnum + -1] / 10.0) + 1;
                  }
                }
                else {
                  j = 0x11;
                }
              }
              else {
                j = 0x10;
              }
            }
            else {
              j = 9;
            }
          }
          else {
            j = 1;
          }
        }
        else {
          j = 0;
        }
        faceangletable[(long)j + 0x11] = faceangletable[(long)j + 0x11] + 1;
      }
      for (tetloop.tet._0_4_ = 0; (int)tetloop.tet < 4; tetloop.tet._0_4_ = (int)tetloop.tet + 1) {
        fsym(this,(triface *)&neightet.ver,(triface *)local_30);
        if ((*(tetrahedron *)((long)local_30 + 0x38) == (tetrahedron)this->dummypoint) ||
           ((ulong)neightet._8_8_ < (ulong)local_30)) {
          sbuf._120_8_ = org(this,(triface *)&neightet.ver);
          p[0] = dest(this,(triface *)&neightet.ver);
          p[1] = apex(this,(triface *)&neightet.ver);
          dVar9 = interiorangle(this,(double *)sbuf._120_8_,p[0],p[1],(double *)0x0);
          faceangle[0] = interiorangle(this,p[0],p[1],(double *)sbuf._120_8_,(double *)0x0);
          faceangle[1] = PI - (dVar9 + faceangle[0]);
          for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
            faceangle[(long)attrnum + -1] = (faceangle[(long)attrnum + -1] * 180.0) / PI;
          }
          for (attrnum = 0; attrnum < 3; attrnum = attrnum + 1) {
            dVar10 = dVar9;
            dVar2 = dVar9;
            if (attrnum != 0) {
              if (bigfaangle <= faceangle[(long)attrnum + -1]) {
                local_708 = bigfaangle;
              }
              else {
                local_708 = faceangle[(long)attrnum + -1];
              }
              bigfaangle = local_708;
              if (faceangle[(long)attrnum + -1] <= (double)radiustable[0xb]) {
                local_710 = (double)radiustable[0xb];
              }
              else {
                local_710 = faceangle[(long)attrnum + -1];
              }
              radiustable[0xb] = (unsigned_long)local_710;
              dVar10 = (double)radiustable[0xb];
              dVar2 = bigfaangle;
            }
            bigfaangle = dVar2;
            radiustable[0xb] = (unsigned_long)dVar10;
            if (faceangle[(long)attrnum + -1] < biggestfaangle) {
              biggestfaangle = faceangle[(long)attrnum + -1];
            }
            if (total_tet_vol < faceangle[(long)attrnum + -1]) {
              total_tet_vol = faceangle[(long)attrnum + -1];
            }
            faceangletable[(long)(int)(faceangle[(long)attrnum + -1] / 10.0) + -1] =
                 faceangletable[(long)(int)(faceangle[(long)attrnum + -1] / 10.0) + -1] + 1;
          }
        }
      }
      dVar9 = sqrt(longlen);
      dVar10 = sqrt(tetaspect);
      dVar10 = dVar10 * shortlen;
      if (dVar10 < biggestratio) {
        biggestratio = dVar10;
      }
      if (smallestdiangle < dVar10) {
        smallestdiangle = dVar10;
      }
      for (i = 0; (aspectratiotable[(long)i + -1] <= dVar10 &&
                  dVar10 != aspectratiotable[(long)i + -1]) && i < 0xb; i = i + 1) {
      }
      dihedangletable[(long)i + 0x11] = dihedangletable[(long)i + 0x11] + 1;
      for (tendegree = 0;
          (aspectratiotable[(long)tendegree + 0xb] <= minheightinv / dVar9 &&
          minheightinv / dVar9 != aspectratiotable[(long)tendegree + 0xb]) && tendegree < 0xb;
          tendegree = tendegree + 1) {
      }
      aspecttable[(long)tendegree + 0xf] = aspecttable[(long)tendegree + 0xf] + 1;
      neightet._8_8_ = tetrahedrontraverse(this);
    }
    else {
      if (0.0 < dVar9) {
        facenormal(this,p[1],p[0],p[2],H + 3,1,(double *)0x0);
        facenormal(this,(point)sbuf._120_8_,p[1],p[2],N[0] + 2,1,(double *)0x0);
        facenormal(this,p[0],(point)sbuf._120_8_,p[2],N[1] + 2,1,(double *)0x0);
        facenormal(this,(point)sbuf._120_8_,p[0],p[1],N[2] + 2,1,(double *)0x0);
        for (attrnum = 0; attrnum < 4; attrnum = attrnum + 1) {
          dVar10 = dot(this,N[(long)attrnum + -1] + 2,N[(long)attrnum + -1] + 2);
          dVar10 = sqrt(dVar10);
          edgelength[(long)attrnum + 5] = dVar10;
          for (local_6bc = 0; local_6bc < 3; local_6bc = local_6bc + 1) {
            N[(long)attrnum + -1][(long)local_6bc + 2] =
                 N[(long)attrnum + -1][(long)local_6bc + 2] / edgelength[(long)attrnum + 5];
          }
        }
        shortlen = edgelength[5] / dVar9;
        for (attrnum = 1; attrnum < 4; attrnum = attrnum + 1) {
          if (shortlen < edgelength[(long)attrnum + 5] / dVar9) {
            shortlen = edgelength[(long)attrnum + 5] / dVar9;
          }
        }
        dVar9 = sqrt(tetaspect);
        minheightinv = dVar9 * 0.5;
        goto LAB_0016a36a;
      }
      pcVar7 = "degenerated";
      if (dVar9 < 0.0) {
        pcVar7 = "inverted";
      }
      uVar4 = pointmark(this,(point)sbuf._120_8_);
      uVar5 = pointmark(this,p[0]);
      uVar6 = pointmark(this,p[1]);
      pointmark(this,p[2]);
      printf("  !! Warning:  A %s tet (%d,%d,%d,%d).\n",pcVar7,(ulong)uVar4,(ulong)uVar5,
             (ulong)uVar6);
      neightet._8_8_ = tetrahedrontraverse(this);
    }
  } while( true );
}

Assistant:

void tetgenmesh::qualitystatistics()
{
  triface tetloop, neightet;
  point p[4];
  char sbuf[128];
  REAL radiusratiotable[12];
  REAL aspectratiotable[12];
  REAL A[4][4], rhs[4], D;
  REAL V[6][3], N[4][3], H[4]; // edge-vectors, face-normals, face-heights.
  REAL edgelength[6], alldihed[6], faceangle[3];
  REAL shortest, longest;
  REAL smallestvolume, biggestvolume;
  REAL smallestratio, biggestratio;
  REAL smallestdiangle, biggestdiangle;
  REAL smallestfaangle, biggestfaangle;
  REAL total_tet_vol, total_tetprism_vol;
  REAL tetvol, minaltitude;
  REAL cirradius, minheightinv; // insradius;
  REAL shortlen, longlen;
  REAL tetaspect, tetradius;
  REAL smalldiangle, bigdiangle;
  REAL smallfaangle, bigfaangle;
  unsigned long radiustable[12];
  unsigned long aspecttable[16];
  unsigned long dihedangletable[18];
  unsigned long faceangletable[18];
  int indx[4];
  int radiusindex;
  int aspectindex;
  int tendegree;
  int i, j;

  printf("Mesh quality statistics:\n\n");

  shortlen = longlen = 0.0;
  smalldiangle = bigdiangle = 0.0;
  total_tet_vol = 0.0;
  total_tetprism_vol = 0.0;

  radiusratiotable[0]  =    0.707;    radiusratiotable[1]  =     1.0;
  radiusratiotable[2]  =      1.1;    radiusratiotable[3]  =     1.2;
  radiusratiotable[4]  =      1.4;    radiusratiotable[5]  =     1.6;
  radiusratiotable[6]  =      1.8;    radiusratiotable[7]  =     2.0;
  radiusratiotable[8]  =      2.5;    radiusratiotable[9]  =     3.0;
  radiusratiotable[10] =     10.0;    radiusratiotable[11] =     0.0;

  aspectratiotable[0]  =      1.5;    aspectratiotable[1]  =     2.0;
  aspectratiotable[2]  =      2.5;    aspectratiotable[3]  =     3.0;
  aspectratiotable[4]  =      4.0;    aspectratiotable[5]  =     6.0;
  aspectratiotable[6]  =     10.0;    aspectratiotable[7]  =    15.0;
  aspectratiotable[8]  =     25.0;    aspectratiotable[9]  =    50.0;
  aspectratiotable[10] =    100.0;    aspectratiotable[11] =     0.0;
  
  for (i = 0; i < 12; i++) radiustable[i] = 0l;
  for (i = 0; i < 12; i++) aspecttable[i] = 0l;
  for (i = 0; i < 18; i++) dihedangletable[i] = 0l;
  for (i = 0; i < 18; i++) faceangletable[i] = 0l;

  minaltitude = xmax - xmin + ymax - ymin + zmax - zmin;
  minaltitude = minaltitude * minaltitude;
  shortest = minaltitude;
  longest = 0.0;
  smallestvolume = minaltitude;
  biggestvolume = 0.0;
  smallestratio = 1e+16; // minaltitude;
  biggestratio = 0.0;
  smallestdiangle = smallestfaangle = 180.0;
  biggestdiangle = biggestfaangle = 0.0;


  int attrnum = numelemattrib - 1;

  // Loop all elements, calculate quality parameters for each element.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {

    if (b->convex) {
      // Skip tets in the exterior.
      if (elemattribute(tetloop.tet, attrnum) == -1.0) {
        tetloop.tet = tetrahedrontraverse();
        continue;
      }
    }

    // Get four vertices: p0, p1, p2, p3.
    for (i = 0; i < 4; i++) p[i] = (point) tetloop.tet[4 + i];

    // Get the tet volume.
    tetvol = orient3dfast(p[1], p[0], p[2], p[3]) / 6.0;
    total_tet_vol += tetvol;
    total_tetprism_vol += tetprismvol(p[0], p[1], p[2], p[3]);

    // Calculate the largest and smallest volume.
    if (tetvol < smallestvolume) {
      smallestvolume = tetvol;
    } 
    if (tetvol > biggestvolume) {
      biggestvolume = tetvol;
    }

    // Set the edge vectors: V[0], ..., V[5]
    for (i = 0; i < 3; i++) V[0][i] = p[0][i] - p[3][i]; // V[0]: p3->p0.
    for (i = 0; i < 3; i++) V[1][i] = p[1][i] - p[3][i]; // V[1]: p3->p1.
    for (i = 0; i < 3; i++) V[2][i] = p[2][i] - p[3][i]; // V[2]: p3->p2.
    for (i = 0; i < 3; i++) V[3][i] = p[1][i] - p[0][i]; // V[3]: p0->p1.
    for (i = 0; i < 3; i++) V[4][i] = p[2][i] - p[1][i]; // V[4]: p1->p2.
    for (i = 0; i < 3; i++) V[5][i] = p[0][i] - p[2][i]; // V[5]: p2->p0.

    // Get the squares of the edge lengths.
    for (i = 0; i < 6; i++) edgelength[i] = dot(V[i], V[i]);

    // Calculate the longest and shortest edge length.
    for (i = 0; i < 6; i++) {
      if (i == 0) {
        shortlen = longlen = edgelength[i];
      } else {
        shortlen = edgelength[i] < shortlen ? edgelength[i] : shortlen;
        longlen  = edgelength[i] > longlen  ? edgelength[i] : longlen;
      }
      if (edgelength[i] > longest) {
        longest = edgelength[i];
      } 
      if (edgelength[i] < shortest) {
        shortest = edgelength[i];
      }
    }

    // Set the matrix A = [V[0], V[1], V[2]]^T.
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) A[j][i] = V[j][i];
    }

    // Decompose A just once.
    if (lu_decmp(A, 3, indx, &D, 0)) {   
      // Get the three faces normals.
      for (j = 0; j < 3; j++) {
        for (i = 0; i < 3; i++) rhs[i] = 0.0;
        rhs[j] = 1.0;  // Positive means the inside direction
        lu_solve(A, 3, indx, rhs, 0);
        for (i = 0; i < 3; i++) N[j][i] = rhs[i];
      }
      // Get the fourth face normal by summing up the first three.
      for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
      // Get the radius of the circumsphere.
      for (i = 0; i < 3; i++) rhs[i] = 0.5 * dot(V[i], V[i]);
      lu_solve(A, 3, indx, rhs, 0);
      cirradius = sqrt(dot(rhs, rhs));
      // Normalize the face normals.
      for (i = 0; i < 4; i++) {
        // H[i] is the inverse of height of its corresponding face.
        H[i] = sqrt(dot(N[i], N[i]));
        for (j = 0; j < 3; j++) N[i][j] /= H[i];
      }
      // Get the radius of the inscribed sphere.
      // insradius = 1.0 / (H[0] + H[1] + H[2] + H[3]);
      // Get the biggest H[i] (corresponding to the smallest height).
      minheightinv = H[0];
      for (i = 1; i < 4; i++) {
        if (H[i] > minheightinv) minheightinv = H[i];
      }
    } else {
      // A nearly degenerated tet.
      if (tetvol <= 0.0) {
        printf("  !! Warning:  A %s tet (%d,%d,%d,%d).\n", 
               tetvol < 0 ? "inverted" : "degenerated", pointmark(p[0]),
               pointmark(p[1]), pointmark(p[2]), pointmark(p[3]));
        // Skip it.        
        tetloop.tet = tetrahedrontraverse();
        continue;
      }
      // Calculate the four face normals.
      facenormal(p[2], p[1], p[3], N[0], 1, NULL);
      facenormal(p[0], p[2], p[3], N[1], 1, NULL);
      facenormal(p[1], p[0], p[3], N[2], 1, NULL);
      facenormal(p[0], p[1], p[2], N[3], 1, NULL);
      // Normalize the face normals.
      for (i = 0; i < 4; i++) {
        // H[i] is the twice of the area of the face.
        H[i] = sqrt(dot(N[i], N[i]));
        for (j = 0; j < 3; j++) N[i][j] /= H[i];
      }
      // Get the biggest H[i] / tetvol (corresponding to the smallest height).
      minheightinv = (H[0] / tetvol);
      for (i = 1; i < 4; i++) {
        if ((H[i] / tetvol) > minheightinv) minheightinv = (H[i] / tetvol);
      }
      // Let the circumradius to be the half of its longest edge length.
      cirradius = 0.5 * sqrt(longlen);
    }

    // Get the dihedrals (in degree) at each edges.
    j = 0;
    for (i = 1; i < 4; i++) {
      alldihed[j] = -dot(N[0], N[i]); // Edge cd, bd, bc.
      if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
      else if (alldihed[j] > 1.0) alldihed[j] = 1;
      alldihed[j] = acos(alldihed[j]) / PI * 180.0;
      j++;
    }
    for (i = 2; i < 4; i++) {
      alldihed[j] = -dot(N[1], N[i]); // Edge ad, ac.
      if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
      else if (alldihed[j] > 1.0) alldihed[j] = 1;
      alldihed[j] = acos(alldihed[j]) / PI * 180.0;
      j++;
    }
    alldihed[j] = -dot(N[2], N[3]); // Edge ab.
    if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
    else if (alldihed[j] > 1.0) alldihed[j] = 1;
    alldihed[j] = acos(alldihed[j]) / PI * 180.0;

    // Calculate the largest and smallest dihedral angles.
    for (i = 0; i < 6; i++) {
      if (i == 0) {
        smalldiangle = bigdiangle = alldihed[i];
      } else {
        smalldiangle = alldihed[i] < smalldiangle ? alldihed[i] : smalldiangle;
        bigdiangle = alldihed[i] > bigdiangle ? alldihed[i] : bigdiangle;
      }
      if (alldihed[i] < smallestdiangle) {
        smallestdiangle = alldihed[i];
      } 
      if (alldihed[i] > biggestdiangle) {
        biggestdiangle = alldihed[i];
      }
      // Accumulate the corresponding number in the dihedral angle histogram.
      if (alldihed[i] < 5.0) {
        tendegree = 0;
      } else if (alldihed[i] >= 5.0 && alldihed[i] < 10.0) {
        tendegree = 1;
      } else if (alldihed[i] >= 80.0 && alldihed[i] < 110.0) {
        tendegree = 9; // Angles between 80 to 110 degree are in one entry.
      } else if (alldihed[i] >= 170.0 && alldihed[i] < 175.0) {
        tendegree = 16;
      } else if (alldihed[i] >= 175.0) {
        tendegree = 17;
      } else {
        tendegree = (int) (alldihed[i] / 10.);
        if (alldihed[i] < 80.0) {
          tendegree++;  // In the left column.
        } else {
          tendegree--;  // In the right column.
        }
      }
      dihedangletable[tendegree]++;
    }



    // Calculate the largest and smallest face angles.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      fsym(tetloop, neightet);
      // Only do the calulation once for a face.
      if (((point) neightet.tet[7] == dummypoint) || 
          (tetloop.tet < neightet.tet)) {
        p[0] = org(tetloop);
        p[1] = dest(tetloop);
        p[2] = apex(tetloop);
        faceangle[0] = interiorangle(p[0], p[1], p[2], NULL);
        faceangle[1] = interiorangle(p[1], p[2], p[0], NULL);
        faceangle[2] = PI - (faceangle[0] + faceangle[1]);
        // Translate angles into degrees.
        for (i = 0; i < 3; i++) {
          faceangle[i] = (faceangle[i] * 180.0) / PI;
        }
        // Calculate the largest and smallest face angles.
        for (i = 0; i < 3; i++) {
          if (i == 0) {
            smallfaangle = bigfaangle = faceangle[i];
          } else {
            smallfaangle = faceangle[i] < smallfaangle ? 
              faceangle[i] : smallfaangle;
            bigfaangle = faceangle[i] > bigfaangle ? faceangle[i] : bigfaangle;
          }
          if (faceangle[i] < smallestfaangle) {
            smallestfaangle = faceangle[i];
          } 
          if (faceangle[i] > biggestfaangle) {
            biggestfaangle = faceangle[i];
          }
          tendegree = (int) (faceangle[i] / 10.);
          faceangletable[tendegree]++;
        }
      }
    }

    // Calculate aspect ratio and radius-edge ratio for this element.
    tetradius = cirradius / sqrt(shortlen);
    // tetaspect = sqrt(longlen) / (2.0 * insradius);
    tetaspect = sqrt(longlen) * minheightinv;
    // Remember the largest and smallest aspect ratio.
    if (tetaspect < smallestratio) {
      smallestratio = tetaspect;
    } 
    if (tetaspect > biggestratio) {
      biggestratio = tetaspect;
    }
    // Accumulate the corresponding number in the aspect ratio histogram.
    aspectindex = 0;
    while ((tetaspect > aspectratiotable[aspectindex]) && (aspectindex < 11)) {
      aspectindex++;
    }
    aspecttable[aspectindex]++;
    radiusindex = 0;
    while ((tetradius > radiusratiotable[radiusindex]) && (radiusindex < 11)) {
      radiusindex++;
    }
    radiustable[radiusindex]++;

    tetloop.tet = tetrahedrontraverse();
  }

  shortest = sqrt(shortest);
  longest = sqrt(longest);
  minaltitude = sqrt(minaltitude);

  printf("  Smallest volume: %16.5g   |  Largest volume: %16.5g\n",
         smallestvolume, biggestvolume);
  printf("  Shortest edge:   %16.5g   |  Longest edge:   %16.5g\n",
         shortest, longest);
  printf("  Smallest asp.ratio: %13.5g   |  Largest asp.ratio: %13.5g\n",
         smallestratio, biggestratio);
  sprintf(sbuf, "%.17g", biggestfaangle);
  if (strlen(sbuf) > 8) {
    sbuf[8] = '\0';
  }
  printf("  Smallest facangle: %14.5g   |  Largest facangle:       %s\n",
         smallestfaangle, sbuf);
  sprintf(sbuf, "%.17g", biggestdiangle);
  if (strlen(sbuf) > 8) {
    sbuf[8] = '\0';
  }
  printf("  Smallest dihedral: %14.5g   |  Largest dihedral:       %s\n\n",
         smallestdiangle, sbuf);

  printf("  Aspect ratio histogram:\n");
  printf("         < %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
         aspectratiotable[0], aspecttable[0], aspectratiotable[5],
         aspectratiotable[6], aspecttable[6]);
  for (i = 1; i < 5; i++) {
    printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
           aspectratiotable[i - 1], aspectratiotable[i], aspecttable[i],
           aspectratiotable[i + 5], aspectratiotable[i + 6],
           aspecttable[i + 6]);
  }
  printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g -            :  %8ld\n",
         aspectratiotable[4], aspectratiotable[5], aspecttable[5],
         aspectratiotable[10], aspecttable[11]);
  printf("  (A tetrahedron's aspect ratio is its longest edge length");
  printf(" divided by its\n");
  printf("    smallest side height)\n\n");

  printf("  Face angle histogram:\n");
  for (i = 0; i < 9; i++) {
    printf("    %3d - %3d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           i * 10, i * 10 + 10, faceangletable[i],
           i * 10 + 90, i * 10 + 100, faceangletable[i + 9]);
  }
  if (minfaceang != PI) {
    printf("  Minimum input face angle is %g (degree).\n",
           minfaceang / PI * 180.0);
  }
  printf("\n");

  printf("  Dihedral angle histogram:\n");
  // Print the three two rows:
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         0, 5, dihedangletable[0], 80, 110, dihedangletable[9]);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         5, 10, dihedangletable[1], 110, 120, dihedangletable[10]);
  // Print the third to seventh rows.
  for (i = 2; i < 7; i++) {
    printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           (i - 1) * 10, (i - 1) * 10 + 10, dihedangletable[i],
           (i - 1) * 10 + 110, (i - 1) * 10 + 120, dihedangletable[i + 9]);
  }
  // Print the last two rows.
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         60, 70, dihedangletable[7], 170, 175, dihedangletable[16]);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         70, 80, dihedangletable[8], 175, 180, dihedangletable[17]);
  if (minfacetdihed != PI) {
    printf("  Minimum input dihedral angle is %g (degree).\n",
           minfacetdihed / PI * 180.0);
  }
  printf("\n");

  printf("\n");
}